

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall gmath::PinholeCamera::reconstructLocal(PinholeCamera *this,Vector3d *q,Vector2d *p)

{
  long *plVar1;
  double *pdVar2;
  double *pdVar3;
  SVector<double,_2> *in_RDX;
  SVector<double,_3> *in_RSI;
  long in_RDI;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double y;
  double x;
  
  dVar4 = SVector<double,_2>::operator[](in_RDX,0);
  dVar5 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),0,0);
  dVar6 = SVector<double,_2>::operator[](in_RDX,1);
  dVar7 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),0,1);
  dVar8 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),0,0);
  dVar9 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,1);
  dVar10 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),0,1);
  dVar11 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,2);
  dVar12 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,1);
  dVar13 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),0,2);
  dVar14 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),0,0);
  dVar15 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,1);
  dVar16 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),2,2);
  pdVar2 = SVector<double,_3>::operator[](in_RSI,0);
  *pdVar2 = (dVar4 / dVar5 - (dVar6 * dVar7) / (dVar8 * dVar9)) +
            (dVar10 * dVar11 + -(dVar12 * dVar13)) / (dVar14 * dVar15 * dVar16);
  dVar4 = SVector<double,_2>::operator[](in_RDX,1);
  dVar5 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,1);
  dVar6 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,2);
  dVar7 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),2,2);
  dVar8 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,1);
  pdVar2 = SVector<double,_3>::operator[](in_RSI,1);
  *pdVar2 = dVar4 / dVar5 - dVar6 / (dVar7 * dVar8);
  pdVar2 = SVector<double,_3>::operator[](in_RSI,2);
  *pdVar2 = 1.0;
  if (*(long *)(in_RDI + 0x110) != 0) {
    pdVar2 = SVector<double,_3>::operator[](in_RSI,0);
    dVar4 = *pdVar2;
    pdVar2 = SVector<double,_3>::operator[](in_RSI,1);
    dVar5 = *pdVar2;
    plVar1 = *(long **)(in_RDI + 0x110);
    pdVar2 = SVector<double,_3>::operator[](in_RSI,0);
    pdVar3 = SVector<double,_3>::operator[](in_RSI,1);
    (**(code **)(*plVar1 + 0x38))(dVar4,dVar5,plVar1,pdVar2,pdVar3);
  }
  return;
}

Assistant:

void PinholeCamera::reconstructLocal(Vector3d &q, const Vector2d &p) const
{
  // apply inverse camera matrix

  q[0]=p[0]/A(0, 0)-p[1]*A(0, 1)/(A(0, 0)*A(1, 1))+
       (A(0, 1)*A(1, 2)-A(1, 1)*A(0, 2))/
       (A(0, 0)*A(1, 1)*A(2, 2));
  q[1]=p[1]/A(1, 1)-A(1, 2)/(A(2, 2)*A(1, 1));
  q[2]=1;

  // apply inverse lens distortion

  if (dist != 0)
  {
    const double x=q[0];
    const double y=q[1];
    dist->invTransform(q[0], q[1], x, y);
  }
}